

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

wchar_t equipped_item_slot(player_body body,object *item)

{
  object **ppoVar1;
  ulong uVar2;
  
  if (item != (object *)0x0) {
    if (body.count == 0) {
      return L'\0';
    }
    ppoVar1 = &(body.slots)->obj;
    uVar2 = 0;
    do {
      if (*ppoVar1 == item) {
        return (wchar_t)uVar2;
      }
      uVar2 = uVar2 + 1;
      ppoVar1 = ppoVar1 + 4;
    } while (body.count != uVar2);
  }
  return (uint)body.count;
}

Assistant:

int equipped_item_slot(struct player_body body, struct object *item)
{
	int i;

	if (item == NULL) return body.count;

	/* Look for an equipment slot with this item */
	for (i = 0; i < body.count; i++)
		if (item == body.slots[i].obj) break;

	/* Correct slot, or body.count if not equipped */
	return i;
}